

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O3

QByteArray * __thiscall
QByteArray::left(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype n)

{
  Data *pDVar1;
  long lVar2;
  char *pcVar3;
  
  lVar2 = (this->d).size;
  if (n < lVar2) {
    QByteArray::resize((longlong)this);
    pDVar1 = (this->d).d;
    (this->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    pcVar3 = (this->d).ptr;
    lVar2 = (this->d).size;
    (this->d).ptr = (char *)0x0;
  }
  else {
    pDVar1 = (this->d).d;
    (this->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    pcVar3 = (this->d).ptr;
    (this->d).ptr = (char *)0x0;
  }
  (__return_storage_ptr__->d).ptr = pcVar3;
  (this->d).size = 0;
  (__return_storage_ptr__->d).size = lVar2;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QByteArray left(qsizetype n) &&
    {
        if (n >= size())
            return std::move(*this);
        return std::move(*this).first(qMax(n, 0));
    }